

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O2

Mat * __thiscall
ncnn::ModelBinFromDataReader::load
          (Mat *__return_storage_ptr__,ModelBinFromDataReader *this,int w,int type)

{
  uint uVar1;
  anon_union_4_2_77b30072 aVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ulong uVar5;
  char *__format;
  Mat *this_00;
  ulong uVar6;
  ulong __new_size;
  long lVar7;
  ulong uVar8;
  anon_union_4_2_77b30072 flag_struct;
  uint local_4a0;
  uint local_49c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> index_array;
  Mat m;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  int local_404;
  size_t local_400;
  undefined4 extraout_var_01;
  
  if (type != 1) {
    if (type != 0) {
      fprintf(_stderr,"ModelBin load type %d not implemented",(ulong)(uint)type);
LAB_0012c8db:
      fputc(10,_stderr);
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
      return __return_storage_ptr__;
    }
    iVar3 = (*this->dr->_vptr_DataReader[3])(this->dr,&flag_struct,4);
    aVar2 = flag_struct;
    if (CONCAT44(extraout_var,iVar3) != 4) {
      fprintf(_stderr,"ModelBin read flag_struct failed %zd",CONCAT44(extraout_var,iVar3));
      goto LAB_0012c8db;
    }
    if (flag_struct.tag == 0x2c056) {
      Mat::Mat((Mat *)&float16_weights,w,4,(Allocator *)0x0);
      if ((float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) &&
         ((long)local_404 * local_400 != 0)) {
        lVar7 = (long)w << 2;
        iVar3 = (*this->dr->_vptr_DataReader[3])
                          (this->dr,float16_weights.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start,lVar7);
        lVar4 = CONCAT44(extraout_var_03,iVar3);
        goto LAB_0012c6a4;
      }
      goto LAB_0012c6ad;
    }
    if (flag_struct.tag == 0xd4b38) {
      uVar6 = (long)w + 3U & 0xfffffffffffffffc;
      float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<signed_char,_std::allocator<signed_char>_>::resize
                ((vector<signed_char,_std::allocator<signed_char>_> *)&float16_weights,uVar6);
      iVar3 = (*this->dr->_vptr_DataReader[3])
                        (this->dr,float16_weights.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_start,uVar6);
      if (CONCAT44(extraout_var_02,iVar3) == uVar6) {
        Mat::Mat(__return_storage_ptr__,w,1,(Allocator *)0x0);
        if ((__return_storage_ptr__->data != (void *)0x0) &&
           ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
          memcpy(__return_storage_ptr__->data,
                 float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                 ._M_impl.super__Vector_impl_data._M_start,(long)w);
        }
      }
      else {
        fprintf(_stderr,"ModelBin read int8_weights failed %zd",CONCAT44(extraout_var_02,iVar3));
        fputc(10,_stderr);
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->cstep = 0;
      }
      std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
                ((_Vector_base<signed_char,_std::allocator<signed_char>_> *)&float16_weights);
      return __return_storage_ptr__;
    }
    if (flag_struct.tag == 0x1306b47) {
      uVar6 = (long)w * 2 + 3U & 0xfffffffffffffffc;
      float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&float16_weights,uVar6);
      iVar3 = (*this->dr->_vptr_DataReader[3])
                        (this->dr,float16_weights.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_start,uVar6);
      if (CONCAT44(extraout_var_00,iVar3) == uVar6) {
        Mat::from_float16(__return_storage_ptr__,
                          float16_weights.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start,w);
      }
      else {
        fprintf(_stderr,"ModelBin read float16_weights failed %zd",CONCAT44(extraout_var_00,iVar3));
        fputc(10,_stderr);
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->cstep = 0;
      }
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                (&float16_weights.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
      return __return_storage_ptr__;
    }
    uVar1 = flag_struct.tag >> 8;
    local_4a0 = flag_struct.tag >> 0x10 & 0xff;
    local_49c = flag_struct.tag >> 0x18;
    Mat::Mat(&m,w,4,(Allocator *)0x0);
    if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
LAB_0012ca73:
      Mat::Mat(__return_storage_ptr__,&m);
    }
    else {
      if ((uVar1 & 0xff) + (aVar2.tag & 0xff) + local_4a0 == 0 && local_49c == 0) {
        if (flag_struct.field_0.f0 == '\0') {
          iVar3 = (*this->dr->_vptr_DataReader[3])(this->dr,m.data,(long)w * 4);
          lVar4 = CONCAT44(extraout_var_06,iVar3);
          if (lVar4 != (long)w * 4) {
            __format = "ModelBin read weight_data failed %zd";
            goto LAB_0012ca03;
          }
        }
        goto LAB_0012ca73;
      }
      iVar3 = (*this->dr->_vptr_DataReader[3])(this->dr,&float16_weights,0x400);
      lVar4 = CONCAT44(extraout_var_04,iVar3);
      if (lVar4 == 0x400) {
        __new_size = (long)w + 3U & 0xfffffffffffffffc;
        index_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        index_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        index_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&index_array,__new_size);
        iVar3 = (*this->dr->_vptr_DataReader[3])
                          (this->dr,index_array.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,__new_size);
        uVar6 = CONCAT44(extraout_var_05,iVar3);
        if (uVar6 == __new_size) {
          uVar5 = 0;
          uVar8 = (ulong)(uint)w;
          if (w < 1) {
            uVar8 = uVar5;
          }
          for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
            *(undefined4 *)((long)m.data + uVar5 * 4) =
                 *(undefined4 *)
                  ((long)&float16_weights.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start +
                  (ulong)index_array.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar5] * 4);
          }
        }
        else {
          fprintf(_stderr,"ModelBin read index_array failed %zd",uVar6);
          fputc(10,_stderr);
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
          *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 0;
          __return_storage_ptr__->w = 0;
          __return_storage_ptr__->h = 0;
          __return_storage_ptr__->c = 0;
          __return_storage_ptr__->cstep = 0;
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&index_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        if (uVar6 == __new_size) goto LAB_0012ca73;
      }
      else {
        __format = "ModelBin read quantization_value failed %zd";
LAB_0012ca03:
        fprintf(_stderr,__format,lVar4);
        fputc(10,_stderr);
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->cstep = 0;
      }
    }
    this_00 = &m;
    goto LAB_0012c6bf;
  }
  Mat::Mat((Mat *)&float16_weights,w,4,(Allocator *)0x0);
  if ((float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start == (pointer)0x0) || ((long)local_404 * local_400 == 0)) {
LAB_0012c6ad:
    Mat::Mat(__return_storage_ptr__,(Mat *)&float16_weights);
  }
  else {
    lVar7 = (long)w << 2;
    iVar3 = (*this->dr->_vptr_DataReader[3])
                      (this->dr,float16_weights.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start,lVar7);
    lVar4 = CONCAT44(extraout_var_01,iVar3);
LAB_0012c6a4:
    if (lVar4 == lVar7) goto LAB_0012c6ad;
    fprintf(_stderr,"ModelBin read weight_data failed %zd",lVar4);
    fputc(10,_stderr);
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->cstep = 0;
  }
  this_00 = (Mat *)&float16_weights;
LAB_0012c6bf:
  Mat::~Mat(this_00);
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromDataReader::load(int w, int type) const
{
    if (type == 0)
    {
        size_t nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = dr.read(&flag_struct, sizeof(flag_struct));
        if (nread != sizeof(flag_struct))
        {
            NCNN_LOGE("ModelBin read flag_struct failed %zd", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            size_t align_data_size = alignSize(w * sizeof(unsigned short), 4);
            std::vector<unsigned short> float16_weights;
            float16_weights.resize(align_data_size);
            nread = dr.read(float16_weights.data(), align_data_size);
            if (nread != align_data_size)
            {
                NCNN_LOGE("ModelBin read float16_weights failed %zd", nread);
                return Mat();
            }

            return Mat::from_float16(float16_weights.data(), w);
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            size_t align_data_size = alignSize(w, 4);
            std::vector<signed char> int8_weights;
            int8_weights.resize(align_data_size);
            nread = dr.read(int8_weights.data(), align_data_size);
            if (nread != align_data_size)
            {
                NCNN_LOGE("ModelBin read int8_weights failed %zd", nread);
                return Mat();
            }

            Mat m(w, (size_t)1u);
            if (m.empty())
                return m;

            memcpy(m.data, int8_weights.data(), w);

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            Mat m(w);
            if (m.empty())
                return m;

            // raw data with extra scaling
            nread = dr.read(m, w * sizeof(float));
            if (nread != w * sizeof(float))
            {
                NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                return Mat();
            }

            return m;
        }

        Mat m(w);
        if (m.empty())
            return m;

        if (flag != 0)
        {
            // quantized data
            float quantization_value[256];
            nread = dr.read(quantization_value, 256 * sizeof(float));
            if (nread != 256 * sizeof(float))
            {
                NCNN_LOGE("ModelBin read quantization_value failed %zd", nread);
                return Mat();
            }

            size_t align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = dr.read(index_array.data(), align_weight_data_size);
            if (nread != align_weight_data_size)
            {
                NCNN_LOGE("ModelBin read index_array failed %zd", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            nread = dr.read(m, w * sizeof(float));
            if (nread != w * sizeof(float))
            {
                NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                return Mat();
            }
        }

        return m;
    }
    else if (type == 1)
    {
        Mat m(w);
        if (m.empty())
            return m;

        // raw data
        size_t nread = dr.read(m, w * sizeof(float));
        if (nread != w * sizeof(float))
        {
            NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
            return Mat();
        }

        return m;
    }
    else
    {
        NCNN_LOGE("ModelBin load type %d not implemented", type);
        return Mat();
    }

    return Mat();
}